

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique.hpp
# Opt level: O2

iterator __thiscall
boost::unordered::detail::
table_impl<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,double>>,unsigned_int,double,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
::find_node_impl<unsigned_int,std::equal_to<unsigned_int>>
          (table_impl<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,double>>,unsigned_int,double,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
           *this,size_t key_hash,uint *k,equal_to<unsigned_int> *eq)

{
  link_pointer ppVar1;
  iterator iVar2;
  ulong bucket_index;
  
  bucket_index = *(long *)(this + 8) - 1U & key_hash;
  iVar2 = table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
          ::begin((table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                   *)this,bucket_index);
  do {
    if (iVar2.node_ == (node_pointer)0x0) {
      return (iterator)(node_pointer)0x0;
    }
    if ((iVar2.node_)->hash_ == key_hash) {
      if (*k == *(uint *)&((iVar2.node_)->super_value_base<std::pair<const_unsigned_int,_double>_>).
                          data_.data_) {
        return (iterator)iVar2.node_;
      }
    }
    else if (((iVar2.node_)->hash_ & *(long *)(this + 8) - 1U) != bucket_index) {
      return (iterator)(node_pointer)0x0;
    }
    ppVar1 = ((iVar2.node_)->super_ptr_bucket).next_;
    iVar2.node_ = (node_pointer)(ppVar1 + -2);
    if (ppVar1 == (link_pointer)0x0) {
      iVar2.node_ = (node_pointer)0x0;
    }
  } while( true );
}

Assistant:

iterator find_node_impl(
                std::size_t key_hash,
                Key const& k,
                Pred const& eq) const
        {
            std::size_t bucket_index = this->hash_to_bucket(key_hash);
            iterator n = this->begin(bucket_index);

            for (;;)
            {
                if (!n.node_) return n;

                std::size_t node_hash = n.node_->hash_;
                if (key_hash == node_hash)
                {
                    if (eq(k, this->get_key(*n)))
                        return n;
                }
                else
                {
                    if (this->hash_to_bucket(node_hash) != bucket_index)
                        return iterator();
                }

                ++n;
            }
        }